

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverSetCubeSizes(Mvc_Cover_t *pCover)

{
  uint uVar1;
  Mvc_CubeWord_t *pMVar2;
  uint uVar3;
  Mvc_Cube_t *pMVar4;
  
  uVar1 = pCover->nBits;
  pMVar4 = (Mvc_Cube_t *)&pCover->lCubes;
  while (pMVar4 = pMVar4->pNext, pMVar4 != (Mvc_Cube_t *)0x0) {
    uVar3 = 0;
    for (pMVar2 = pMVar4->pData;
        pMVar2 < (byte *)((long)pMVar4->pData +
                         (long)(int)(((int)((ulong)(long)(int)uVar1 >> 3) + 1) -
                                    (uint)((uVar1 & 7) == 0)));
        pMVar2 = (Mvc_CubeWord_t *)((long)pMVar2 + 1)) {
      uVar3 = uVar3 + bit_count[(byte)*pMVar2];
    }
    *(uint *)(&pMVar4->field_0x8 + 4) = uVar3;
  }
  return 1;
}

Assistant:

int Mvc_CoverSetCubeSizes( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;

    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    Mvc_CoverForEachCube( pCover, pCube )
    {
        // clean the counter of ones
        nOnes = 0;
        // set the starting and stopping positions
        pByteStart = (unsigned char *)pCube->pData;
        pByteStop  = pByteStart + nBytes;
        // iterate through the positions
        for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
            nOnes += bit_count[*pByte];
        // set the nOnes
        Mvc_CubeSetSize( pCube, nOnes );
    }
    return 1;
}